

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cor_broker.cpp
# Opt level: O0

ostream * operator<<(ostream *out,Creature *cr)

{
  int iVar1;
  ostream *poVar2;
  Creature *cr_local;
  ostream *out_local;
  
  poVar2 = std::operator<<(out,"[Creature ");
  poVar2 = std::operator<<(poVar2,(string *)&cr->name);
  poVar2 = std::operator<<(poVar2,", attack = ");
  iVar1 = Creature::attack(cr);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = std::operator<<(poVar2,", defense = ");
  iVar1 = Creature::defense(cr);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = std::operator<<(poVar2,"]");
  return poVar2;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const Creature& cr)
	{
		return out << "[Creature " << cr.name << ", attack = " << cr.attack() << ", defense = " << cr.defense() << "]";
	}